

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

void push_onecapture(MatchState *ms,int i,char *s,char *e)

{
  size_t len;
  ptrdiff_t l;
  char *e_local;
  char *s_local;
  int i_local;
  MatchState *ms_local;
  
  if (i < ms->level) {
    len = ms->capture[i].len;
    if (len == 0xffffffffffffffff) {
      luaL_error(ms->L,"unfinished capture");
    }
    if (len == 0xfffffffffffffffe) {
      lua_pushinteger(ms->L,(lua_Integer)(ms->capture[i].init + (1 - (long)ms->src_init)));
    }
    else {
      lua_pushlstring(ms->L,ms->capture[i].init,len);
    }
  }
  else if (i == 0) {
    lua_pushlstring(ms->L,s,(long)e - (long)s);
  }
  else {
    luaL_error(ms->L,"invalid capture index");
  }
  return;
}

Assistant:

static void push_onecapture (MatchState *ms, int i, const char *s,
                                                    const char *e) {
  if (i >= ms->level) {
    if (i == 0)  /* ms->level == 0, too */
      lua_pushlstring(ms->L, s, e - s);  /* add whole match */
    else
      luaL_error(ms->L, "invalid capture index");
  }
  else {
    ptrdiff_t l = ms->capture[i].len;
    if (l == CAP_UNFINISHED) luaL_error(ms->L, "unfinished capture");
    if (l == CAP_POSITION)
      lua_pushinteger(ms->L, ms->capture[i].init - ms->src_init + 1);
    else
      lua_pushlstring(ms->L, ms->capture[i].init, l);
  }
}